

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::NewSlot(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  bool bVar3;
  uint uVar4;
  SQString *x;
  SQChar *pSVar5;
  SQChar *pSVar6;
  undefined1 local_a0 [8];
  SQObjectPtr oval;
  SQObjectPtr closure_1;
  SQObjectPtr res_1;
  undefined1 local_68 [8];
  SQObjectPtr closure;
  undefined1 local_48 [8];
  SQObjectPtr res;
  bool rawcall;
  bool bstatic_local;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQVM *this_local;
  
  res.super_SQObject._unVal.nInteger._7_1_ = bstatic;
  if ((key->super_SQObject)._type == OT_NULL) {
    Raise_Error(this,"null cannot be used as index");
    this_local._7_1_ = 0;
    goto LAB_0013ff91;
  }
  SVar1 = (self->super_SQObject)._type;
  if (SVar1 == OT_CLASS) {
    bVar3 = SQClass::NewSlot((self->super_SQObject)._unVal.pClass,this->_sharedstate,key,val,bstatic
                            );
    if (!bVar3) {
      if ((((self->super_SQObject)._unVal.pClass)->_locked & 1U) == 0) {
        x = PrintObjVal(this,key);
        ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_a0,x);
        Raise_Error(this,"the property \'%s\' already exists",oval.super_SQObject._0_8_ + 0x38);
        this_local._7_1_ = 0;
        ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_a0);
      }
      else {
        Raise_Error(this,"trying to modify a class that has already been instantiated");
        this_local._7_1_ = 0;
      }
      goto LAB_0013ff91;
    }
  }
  else if (SVar1 == OT_TABLE) {
    res.super_SQObject._unVal.nInteger._6_1_ = 1;
    if ((((self->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate != (SQTable *)0x0) {
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_48);
      bVar3 = SQTable::Get((self->super_SQObject)._unVal.pTable,key,(SQObjectPtr *)local_48);
      if (bVar3) {
LAB_0013fcc2:
        bVar3 = false;
      }
      else {
        ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_68);
        if (((((self->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate == (SQTable *)0x0
            ) || (pSVar2 = (self->super_SQObject)._unVal.pTable,
                 uVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                           _vptr_SQRefCounted[6])(pSVar2,this,0xd,local_68), (uVar4 & 1) == 0)) {
          res.super_SQObject._unVal.nInteger._6_1_ = 1;
LAB_0013fca7:
          bVar3 = false;
        }
        else {
          Push(this,self);
          Push(this,key);
          Push(this,val);
          bVar3 = CallMetaMethod(this,(SQObjectPtr *)local_68,MT_NEWSLOT,3,(SQObjectPtr *)local_48);
          if (bVar3) {
            res.super_SQObject._unVal.nInteger._6_1_ = 0;
            goto LAB_0013fca7;
          }
          this_local._7_1_ = 0;
          bVar3 = true;
        }
        ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_68);
        if (!bVar3) goto LAB_0013fcc2;
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_48);
      if (bVar3) goto LAB_0013ff91;
    }
    if ((res.super_SQObject._unVal.nInteger._6_1_ & 1) != 0) {
      SQTable::NewSlot((self->super_SQObject)._unVal.pTable,key,val);
    }
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      pSVar5 = GetTypeName(self);
      pSVar6 = GetTypeName(key);
      Raise_Error(this,"indexing %s with %s",pSVar5,pSVar6);
      this_local._7_1_ = 0;
      goto LAB_0013ff91;
    }
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&closure_1.super_SQObject._unVal);
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&oval.super_SQObject._unVal);
    if (((((self->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate == (SQTable *)0x0) ||
       (pSVar2 = (self->super_SQObject)._unVal.pTable,
       uVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                 _vptr_SQRefCounted[6])(pSVar2,this,0xd,&oval.super_SQObject._unVal),
       (uVar4 & 1) == 0)) {
      Raise_Error(this,"class instances do not support the new slot operator");
      this_local._7_1_ = 0;
      res_1.super_SQObject._unVal.nInteger._4_4_ = 1;
    }
    else {
      Push(this,self);
      Push(this,key);
      Push(this,val);
      bVar3 = CallMetaMethod(this,(SQObjectPtr *)&oval.super_SQObject._unVal,MT_NEWSLOT,3,
                             (SQObjectPtr *)&closure_1.super_SQObject._unVal);
      if (bVar3) {
        res_1.super_SQObject._unVal.nInteger._4_4_ = 2;
      }
      else {
        this_local._7_1_ = 0;
        res_1.super_SQObject._unVal.nInteger._4_4_ = 1;
      }
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&oval.super_SQObject._unVal);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&closure_1.super_SQObject._unVal);
    if (res_1.super_SQObject._unVal.nInteger._4_4_ == 1) goto LAB_0013ff91;
  }
  this_local._7_1_ = 1;
LAB_0013ff91:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SQVM::NewSlot(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    if(type(key) == OT_NULL) { Raise_Error(_SC("null cannot be used as index")); return false; }
    switch(type(self)) {
    case OT_TABLE: {
        bool rawcall = true;
        if(_table(self)->_delegate) {
            SQObjectPtr res;
            if(!_table(self)->Get(key,res)) {
                SQObjectPtr closure;
                if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
                    Push(self);Push(key);Push(val);
                    if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                        return false;
                    }
                    rawcall = false;
                }
                else {
                    rawcall = true;
                }
            }
        }
        if(rawcall) _table(self)->NewSlot(key,val); //cannot fail

        break;}
    case OT_INSTANCE: {
        SQObjectPtr res;
        SQObjectPtr closure;
        if(_delegable(self)->_delegate && _delegable(self)->GetMetaMethod(this,MT_NEWSLOT,closure)) {
            Push(self);Push(key);Push(val);
            if(!CallMetaMethod(closure,MT_NEWSLOT,3,res)) {
                return false;
            }
            break;
        }
        Raise_Error(_SC("class instances do not support the new slot operator"));
        return false;
        break;}
    case OT_CLASS:
        if(!_class(self)->NewSlot(_ss(this),key,val,bstatic)) {
            if(_class(self)->_locked) {
                Raise_Error(_SC("trying to modify a class that has already been instantiated"));
                return false;
            }
            else {
                SQObjectPtr oval = PrintObjVal(key);
                Raise_Error(_SC("the property '%s' already exists"),_stringval(oval));
                return false;
            }
        }
        break;
    default:
        Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key));
        return false;
        break;
    }
    return true;
}